

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
makeLocalGet<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  Ok local_ad;
  uint local_ac;
  Err local_a8;
  Err *local_88;
  Err *err;
  undefined1 local_70 [8];
  Result<wasm::WATParser::Ok> _val;
  Result<wasm::WATParser::Ok> local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20);
  localidx<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
            ((Result<wasm::WATParser::Ok> *)__return_storage_ptr___00,ctx);
  Result<wasm::WATParser::Ok>::Result
            ((Result<wasm::WATParser::Ok> *)local_70,
             (Result<wasm::WATParser::Ok> *)__return_storage_ptr___00);
  local_88 = Result<wasm::WATParser::Ok>::getErr((Result<wasm::WATParser::Ok> *)local_70);
  bVar1 = local_88 != (Err *)0x0;
  if (bVar1) {
    WATParser::Err::Err(&local_a8,local_88);
    Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_a8);
    WATParser::Err::~Err(&local_a8);
  }
  local_ac = (uint)bVar1;
  Result<wasm::WATParser::Ok>::~Result((Result<wasm::WATParser::Ok> *)local_70);
  if (local_ac == 0) {
    Result<wasm::WATParser::Ok>::operator*
              ((Result<wasm::WATParser::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
    NullInstrParserCtx::makeLocalGet((NullInstrParserCtx *)ctx,pos);
    Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_ad);
    local_ac = 1;
  }
  Result<wasm::WATParser::Ok>::~Result
            ((Result<wasm::WATParser::Ok> *)
             ((long)&_val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT> makeLocalGet(Ctx& ctx, Index pos) {
  auto local = localidx(ctx);
  CHECK_ERR(local);
  return ctx.makeLocalGet(pos, *local);
}